

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O1

void __thiscall summarycalc::dosummaryprocessing(summarycalc *this,int samplesize)

{
  pointer piVar1;
  uint uVar2;
  bool bVar3;
  int event_id;
  OASIS_FLOAT **ppOVar4;
  size_t sVar5;
  int i;
  long lVar6;
  int coverage_or_output_id;
  int i_3;
  sampleslevelRec sr;
  fmlevelhdr fh;
  OASIS_FLOAT local_50;
  int local_48;
  OASIS_FLOAT local_44;
  int local_40;
  int local_3c;
  uint local_38;
  int local_34;
  
  lVar6 = 0;
  do {
    if (this->fout[lVar6] != (FILE *)0x0) {
      ppOVar4 = alloc_ssl_arrays(this,(int)lVar6,samplesize);
      this->sssl[lVar6] = ppOVar4;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  lVar6 = 0;
  do {
    if (this->fout[lVar6] != (FILE *)0x0) {
      reset_ssl_array(this,(int)lVar6,samplesize,this->sssl[lVar6]);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  alloc_sse_array(this);
  reset_sse_array(this);
  lVar6 = 0;
  do {
    if (this->fout[lVar6] != (FILE *)0x0) {
      outputsamplesizeandsummaryset(this,(int)lVar6,samplesize);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  sVar5 = fread(&local_40,8,1,_stdin);
  if ((int)sVar5 == 1) {
    local_38 = 0;
    do {
      event_id = local_40;
      piVar1 = (this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      coverage_or_output_id = local_3c;
      if ((this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar1) {
        coverage_or_output_id = piVar1[local_3c];
      }
      local_34 = local_3c;
      uVar2 = local_38 & 1;
      local_38 = local_38 & 0xff;
      sVar5 = 1;
      if (uVar2 == 0) {
        local_38 = 1;
      }
      local_50 = 0.0;
      do {
        if ((int)sVar5 == 0) break;
        sVar5 = fread(&local_48,8,1,_stdin);
        bVar3 = true;
        if ((int)sVar5 != 0) {
          switch(local_48) {
          case 0:
            goto switchD_001043f4_caseD_0;
          case -5:
            dosummary_maxloss(this,samplesize,event_id,coverage_or_output_id,-5,local_44);
            break;
          case -4:
            break;
          case -3:
            local_50 = local_44;
            break;
          default:
            dosummary(this,samplesize,event_id,local_34,coverage_or_output_id,local_48,local_44,
                      local_50);
          }
          bVar3 = false;
        }
switchD_001043f4_caseD_0:
      } while (!bVar3);
      sVar5 = fread(&local_40,8,1,_stdin);
    } while ((int)sVar5 == 1);
    if ((local_38 & 1) != 0) {
      lVar6 = 0;
      do {
        if (this->fout[lVar6] != (FILE *)0x0) {
          outputsummaryset(this,samplesize,(int)lVar6,local_40);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 10);
    }
  }
  return;
}

Assistant:

void summarycalc::dosummaryprocessing(int samplesize)
{
	alloc_sssl_array(samplesize);
	reset_sssl_array(samplesize);
	alloc_sse_array();
	reset_sse_array();
	outputsamplesize(samplesize);
	fmlevelhdr fh;	
	bool havedata = false;
	int i = 1;
	while ((i = (int)fread(&fh, sizeof(fh), 1, stdin)) == 1) {
		OASIS_FLOAT expure_val = 0;
		int cov_id = getcovid(fh.output_id);
		if (i > 0 && havedata == false) havedata = true;
		while (i != 0) {
			sampleslevelRec sr;
			i = (int)fread(&sr, sizeof(sr), 1, stdin);
			if (i == 0) break;
			if (sr.sidx == 0) break;
			if (sr.sidx == number_of_affected_risk_idx) continue;
			if (sr.sidx == tiv_idx) {
				expure_val = sr.loss;
			} else if (sr.sidx == max_loss_idx) {
				dosummary_maxloss(samplesize, fh.event_id,
						  cov_id, sr.sidx, sr.loss);
			} else {
				dosummary(samplesize, fh.event_id, fh.output_id,
					  cov_id, sr.sidx, sr.loss, expure_val);
			}
		}
	}
	if (havedata) outputsummary(samplesize, fh.event_id);
}